

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_0::genFrgShaderSrc
                   (string *__return_storage_ptr__,deUint32 seed,
                   vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   *inputs,string *varName,bool uniform,float value)

{
  DataType dataType;
  DataType DVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  pointer pVVar6;
  ulong uVar7;
  float fVar8;
  int local_2c4;
  string exp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  Random rnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream oss;
  
  deRandom_init(&rnd.m_rnd,seed);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(undefined8 *)
   (&oss.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
   (long)oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 4;
  *(undefined8 *)
   (&oss.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10 +
   (long)oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 7;
  std::operator<<((ostream *)&oss,"#version 310 es\n");
  std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"precision highp float;\n"
                 );
  std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"out vec4 fragColor;\n");
  printFloatDeclaration(&oss,varName,uniform,value);
  for (pVVar6 = (inputs->
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pVVar6 != (inputs->
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                )._M_impl.super__Vector_impl_data._M_finish; pVVar6 = pVVar6 + 1) {
    poVar3 = glu::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,pVVar6);
    std::operator<<(poVar3,";\n");
  }
  poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,
                           "int imod (int n, int d)");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"{");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"return (n < 0 ? d - 1 - (-1 - n) % d : n % d);");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,
                           "vec4 hsv (vec3 hsv)");
  poVar3 = std::operator<<(poVar3,"{");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tfloat h = hsv.x * 3.0;\n");
  poVar3 = std::operator<<(poVar3,"\tfloat r = max(0.0, 1.0 - h) + max(0.0, h - 2.0);\n");
  poVar3 = std::operator<<(poVar3,"\tfloat g = max(0.0, 1.0 - abs(h - 1.0));\n");
  poVar3 = std::operator<<(poVar3,"\tfloat b = max(0.0, 1.0 - abs(h - 2.0));\n");
  poVar3 = std::operator<<(poVar3,"\tvec3 hs = mix(vec3(1.0), vec3(r, g, b), hsv.y);\n");
  poVar3 = std::operator<<(poVar3,"\treturn vec4(hsv.z * hs, 1.0);\n");
  std::operator<<(poVar3,"}\n");
  poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,
                           "void main (void)\n");
  std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  poVar3 = std::operator<<(poVar3,"fragColor = vec4(vec3(");
  poVar3 = std::operator<<(poVar3,(string *)varName);
  poVar3 = std::operator<<(poVar3,"), 1.0);");
  std::operator<<(poVar3,"\n");
  if ((inputs->
      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (inputs->
      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
    std::operator<<(poVar3,"switch (imod(int(0.5 * (");
    fVar8 = deRandom_getFloat(&rnd.m_rnd);
    printFloat(&oss,(double)(fVar8 * 1.5 + 0.5));
    std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>," * gl_FragCoord.x - ");
    fVar8 = deRandom_getFloat(&rnd.m_rnd);
    printFloat(&oss,(double)(fVar8 * 1.5 + 0.5));
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,
                             " * gl_FragCoord.y)), ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"))");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,"\n");
    lVar5 = 0x40;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)(inputs->
                               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inputs->
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x60); uVar7 = uVar7 + 1
        ) {
      poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t\t");
      poVar3 = std::operator<<(poVar3,"case ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\t\t\t");
      std::operator<<(poVar3,"fragColor *= ");
      pVVar6 = (inputs->
               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dataType = *(DataType *)((long)pVVar6 + lVar5 + -0x18);
      std::__cxx11::string::string
                ((string *)&exp,(string *)((long)&(pVVar6->layout).location + lVar5));
      DVar1 = glu::getDataTypeScalarType(dataType);
      if ((DVar1 | TYPE_FLOAT_VEC4) == TYPE_UINT) {
        DVar1 = glu::getDataTypeFloatScalars(dataType);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        local_298._M_string_length = 0;
        local_298.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_268,&local_298,"(");
        pcVar4 = glu::getDataTypeName(DVar1);
        std::operator+(&local_208,&local_268,pcVar4);
        std::operator+(&local_1e8,&local_208,"(");
        std::operator+(&local_1c8,&local_1e8,&exp);
        std::operator+(&local_248,&local_1c8,") / 255.0");
        std::operator+(&local_228,&local_248,")");
        std::__cxx11::string::operator=((string *)&exp,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_298);
      }
      if (((TYPE_UINT_VEC4 < dataType) || ((0x7f803c01eU >> ((ulong)dataType & 0x3f) & 1) == 0)) &&
         (3 < dataType - TYPE_BOOL)) {
        if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
          local_2c4 = glu::getDataTypeMatrixNumRows(dataType);
          iVar2 = glu::getDataTypeMatrixNumColumns(dataType);
          if (local_2c4 == iVar2) {
            poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,
                                     "hsv(vec3(determinant(");
            poVar3 = std::operator<<(poVar3,(string *)&exp);
            pcVar4 = ")))";
          }
          else {
            if (2 < iVar2 && local_2c4 != 3) {
              std::operator+(&local_248,"transpose(",&exp);
              std::operator+(&local_228,&local_248,")");
              std::__cxx11::string::operator=((string *)&exp,(string *)&local_228);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::string::~string((string *)&local_248);
              local_2c4 = iVar2;
            }
            std::operator+(&local_228,&exp,"[0]");
            std::__cxx11::string::operator=((string *)&exp,(string *)&local_228);
            std::__cxx11::string::~string((string *)&local_228);
            if (3 < local_2c4) {
              std::operator+(&local_228,&exp,".xyz");
              std::__cxx11::string::operator=((string *)&exp,(string *)&local_228);
              std::__cxx11::string::~string((string *)&local_228);
            }
            poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"hsv(")
            ;
            poVar3 = std::operator<<(poVar3,(string *)&exp);
            pcVar4 = ")";
          }
          std::operator<<(poVar3,pcVar4);
        }
        goto switchD_01247c97_default;
      }
      iVar2 = glu::getDataTypeScalarSize(dataType);
      switch(iVar2) {
      case 1:
        poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"hsv(vec3("
                                );
        poVar3 = std::operator<<(poVar3,(string *)&exp);
        pcVar4 = ", 1.0, 1.0))";
        break;
      case 2:
        poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"hsv(vec3("
                                );
        poVar3 = std::operator<<(poVar3,(string *)&exp);
        pcVar4 = ", 1.0))";
        break;
      case 3:
        poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"vec4(");
        poVar3 = std::operator<<(poVar3,(string *)&exp);
        pcVar4 = ", 1.0)";
        break;
      case 4:
        std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&exp);
      default:
        goto switchD_01247c97_default;
      }
      std::operator<<(poVar3,pcVar4);
switchD_01247c97_default:
      std::__cxx11::string::~string((string *)&exp);
      poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,";");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\t\t\t");
      poVar3 = std::operator<<(poVar3,"break;");
      std::operator<<(poVar3,"\n");
      lVar5 = lVar5 + 0x60;
    }
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t\t");
    poVar3 = std::operator<<(poVar3,"case ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,":\n");
    poVar3 = std::operator<<(poVar3,"\t\t\t");
    poVar3 = std::operator<<(poVar3,"fragColor = vec4(1.0, 0.0, 1.0, 1.0);");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t\t\t");
    poVar3 = std::operator<<(poVar3,"break;");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t\t");
    poVar3 = std::operator<<(poVar3,"case -1:\n");
    poVar3 = std::operator<<(poVar3,"\t\t\t");
    poVar3 = std::operator<<(poVar3,"fragColor = vec4(1.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t\t\t");
    poVar3 = std::operator<<(poVar3,"break;");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t\t");
    poVar3 = std::operator<<(poVar3,"default:");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\t\t\t");
    poVar3 = std::operator<<(poVar3,"fragColor = vec4(1.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
    std::operator<<(poVar3,"}\n");
  }
  std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string genFrgShaderSrc (deUint32							seed,
						const vector<VariableDeclaration>&	inputs,
						const string&						varName,
						bool								uniform,
						float								value = 0.0)
{
	Random				rnd		(seed);
	ostringstream		oss;

	oss.precision(4);
	oss.width(7);
	oss << "#version 310 es\n";

	oss << "precision highp float;\n";

	oss << "out vec4 fragColor;\n";

	printFloatDeclaration(oss, varName, uniform, value);

	for (vector<VariableDeclaration>::const_iterator it = inputs.begin();
		 it != inputs.end(); ++it)
		oss << *it << ";\n";

	// glsl % isn't defined for negative numbers
	oss << "int imod (int n, int d)" << "\n"
		<< "{" << "\n"
		<< "\t" << "return (n < 0 ? d - 1 - (-1 - n) % d : n % d);" << "\n"
		<< "}" << "\n";

	oss << "vec4 hsv (vec3 hsv)"
		<< "{" << "\n"
		<< "\tfloat h = hsv.x * 3.0;\n"
		<< "\tfloat r = max(0.0, 1.0 - h) + max(0.0, h - 2.0);\n"
		<< "\tfloat g = max(0.0, 1.0 - abs(h - 1.0));\n"
		<< "\tfloat b = max(0.0, 1.0 - abs(h - 2.0));\n"
		<< "\tvec3 hs = mix(vec3(1.0), vec3(r, g, b), hsv.y);\n"
		<< "\treturn vec4(hsv.z * hs, 1.0);\n"
		<< "}\n";

	oss << "void main (void)\n"
		<< "{\n";

	oss << "\t" << "fragColor = vec4(vec3(" << varName << "), 1.0);" << "\n";

	if (inputs.size() > 0)
	{
		oss << "\t"
			<< "switch (imod(int(0.5 * (";

		printFloat(oss, rnd.getFloat(0.5f, 2.0f));
		oss << " * gl_FragCoord.x - ";

		printFloat(oss, rnd.getFloat(0.5f, 2.0f));
		oss << " * gl_FragCoord.y)), "
			<< inputs.size() << "))" << "\n"
			<< "\t" << "{" << "\n";

		for (size_t i = 0; i < inputs.size(); ++i)
		{
			oss << "\t\t" << "case " << i << ":" << "\n"
				<< "\t\t\t" << "fragColor *= ";

			printInputColor(oss, inputs[i]);

			oss << ";" << "\n"
				<< "\t\t\t" << "break;" << "\n";
		}

		oss << "\t\t" << "case " << inputs.size() << ":\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 0.0, 1.0, 1.0);" << "\n";
		oss << "\t\t\t" << "break;" << "\n";

		oss << "\t\t" << "case -1:\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 1.0, 0.0, 1.0);" << "\n";
		oss << "\t\t\t" << "break;" << "\n";

		oss << "\t\t" << "default:" << "\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 1.0, 0.0, 1.0);" << "\n";

		oss << "\t" << "}\n";

	}

	oss << "}\n";

	return oss.str();
}